

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_pack(REF_NODE ref_node,REF_INT *o2n,REF_INT *n2o)

{
  int iVar1;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  undefined8 uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  long lVar13;
  REF_NODE copy;
  
  uVar4 = ref_node_deep_copy(&copy,ref_node->ref_mpi,ref_node);
  if (uVar4 == 0) {
    uVar4 = ref_node->n;
    lVar6 = (long)(int)uVar4;
    uVar8 = 0;
    uVar10 = 0;
    if (0 < (int)uVar4) {
      uVar10 = (ulong)uVar4;
    }
    for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
      ref_node->global[uVar8] = copy->global[n2o[uVar8]];
    }
    iVar5 = ref_node->max;
    if ((int)uVar4 < iVar5) {
      lVar11 = -3 - lVar6;
      for (; lVar6 < iVar5; lVar6 = lVar6 + 1) {
        ref_node->global[lVar6] = lVar11;
        lVar11 = lVar11 + -1;
      }
      ref_node->global[(long)iVar5 + -1] = -1;
      iVar5 = -2 - uVar4;
    }
    else {
      iVar5 = -1;
    }
    ref_node->blank = iVar5;
    for (lVar6 = 0; lVar6 < (int)uVar4; lVar6 = lVar6 + 1) {
      ref_node->sorted_local[lVar6] = o2n[copy->sorted_local[lVar6]];
      uVar4 = ref_node->n;
    }
    for (lVar6 = 0; lVar6 < (int)uVar4; lVar6 = lVar6 + 1) {
      ref_node->part[lVar6] = copy->part[n2o[lVar6]];
      uVar4 = ref_node->n;
    }
    for (lVar6 = 0; lVar6 < (int)uVar4; lVar6 = lVar6 + 1) {
      ref_node->age[lVar6] = copy->age[n2o[lVar6]];
      uVar4 = ref_node->n;
    }
    uVar10 = 0;
    uVar8 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar8 = uVar10;
    }
    for (uVar9 = 0; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      iVar5 = n2o[uVar9];
      pRVar2 = copy->real;
      pRVar3 = ref_node->real;
      for (lVar6 = 0; lVar6 != 0xf; lVar6 = lVar6 + 1) {
        *(REF_DBL *)((long)pRVar3 + lVar6 * 8 + uVar10) = pRVar2[iVar5 * 0xf + lVar6];
      }
      uVar10 = uVar10 + 0x78;
    }
    lVar6 = (long)ref_node->naux;
    if (0 < lVar6) {
      lVar11 = 0;
      for (uVar10 = 0; uVar10 != uVar8; uVar10 = uVar10 + 1) {
        iVar5 = n2o[uVar10];
        iVar1 = copy->naux;
        pRVar2 = copy->aux;
        pRVar3 = ref_node->aux;
        for (lVar13 = 0; lVar6 != lVar13; lVar13 = lVar13 + 1) {
          *(REF_DBL *)((long)pRVar3 + lVar13 * 8 + lVar11) = pRVar2[iVar5 * iVar1 + (int)lVar13];
        }
        lVar11 = lVar11 + lVar6 * 8;
      }
    }
    uVar4 = ref_node_free(copy);
    if (uVar4 == 0) {
      return 0;
    }
    pcVar12 = "release copy";
    uVar7 = 0xd2;
  }
  else {
    pcVar12 = "make a copy first";
    uVar7 = 0xb2;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar7,
         "ref_node_pack",(ulong)uVar4,pcVar12);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_node_pack(REF_NODE ref_node, REF_INT *o2n,
                                 REF_INT *n2o) {
  REF_INT i, node;
  REF_NODE copy;
  RSS(ref_node_deep_copy(&copy, ref_node_mpi(ref_node), ref_node),
      "make a copy first");

  for (node = 0; node < ref_node_n(ref_node); node++)
    ref_node->global[node] = copy->global[n2o[node]];
  if (ref_node_n(ref_node) < ref_node_max(ref_node)) {
    for (node = ref_node_n(ref_node); node < ref_node_max(ref_node); node++)
      ref_node->global[node] = index2next(node + 1);
    ref_node->global[(ref_node->max) - 1] = REF_EMPTY;
    ref_node->blank = index2next(ref_node_n(ref_node));
  } else {
    ref_node->blank = REF_EMPTY;
  }

  for (node = 0; node < ref_node_n(ref_node); node++)
    ref_node->sorted_local[node] = o2n[copy->sorted_local[node]];

  for (node = 0; node < ref_node_n(ref_node); node++)
    ref_node->part[node] = copy->part[n2o[node]];

  for (node = 0; node < ref_node_n(ref_node); node++)
    ref_node->age[node] = copy->age[n2o[node]];

  for (node = 0; node < ref_node_n(ref_node); node++)
    for (i = 0; i < REF_NODE_REAL_PER; i++)
      ref_node_real(ref_node, i, node) = ref_node_real(copy, i, n2o[node]);

  if (ref_node_naux(ref_node) > 0) {
    for (node = 0; node < ref_node_n(ref_node); node++)
      for (i = 0; i < ref_node_naux(ref_node); i++)
        ref_node_aux(ref_node, i, node) = ref_node_aux(copy, i, n2o[node]);
  }

  RSS(ref_node_free(copy), "release copy");

  return REF_SUCCESS;
}